

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O1

void __thiscall SAUF_BG<UFPC>::FirstScan(SAUF_BG<UFPC> *this)

{
  long lVar1;
  uint uVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint j;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long local_48;
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  lVar7 = (long)*(int *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  if (0 < lVar7) {
    local_48 = -1;
    lVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
        lVar5 = *(long *)&pMVar3->field_0x10;
        lVar11 = **(long **)&pMVar3->field_0x48;
        lVar9 = *(long *)&pMVar4->field_0x10;
        lVar12 = **(long **)&pMVar4->field_0x48;
        lVar1 = lVar9 + lVar12 * lVar8;
        lVar10 = lVar1 + -4;
        lVar9 = lVar9 + lVar12 * local_48;
        lVar12 = lVar11 * local_48 + lVar5;
        lVar5 = lVar5 + lVar11 * lVar8;
        lVar11 = lVar5 + -1;
        uVar13 = 0;
        do {
          if (*(char *)(lVar5 + uVar13) == '\0') {
            if ((lVar8 == 0) || (*(char *)(lVar12 + uVar13) != '\0')) {
              if ((uVar13 == 0) || (*(char *)(lVar11 + uVar13) != '\0')) {
LAB_0021746d:
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar6 = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
              }
              else {
LAB_00217467:
                uVar6 = *(uint *)(lVar10 + uVar13 * 4);
              }
            }
            else {
              if ((uVar13 == 0) || (*(char *)(lVar11 + uVar13) != '\0')) goto LAB_002173e5;
              uVar6 = *(uint *)(lVar9 + uVar13 * 4);
              j = *(uint *)(lVar10 + uVar13 * 4);
LAB_002174b6:
              uVar6 = UFPC::Merge(uVar6,j);
            }
          }
          else if ((lVar8 == 0) || (*(char *)(lVar12 + uVar13) == '\0')) {
            if ((lVar8 == 0) ||
               (((long)(int)uVar2 + -1 <= (long)uVar13 || (*(char *)(lVar12 + 1 + uVar13) == '\0')))
               ) {
              if ((uVar13 == 0 || lVar8 == 0) || (*(char *)(lVar12 + -1 + uVar13) == '\0')) {
                if ((uVar13 == 0) || (*(char *)(lVar11 + uVar13) == '\0')) goto LAB_0021746d;
                goto LAB_00217467;
              }
              uVar6 = *(uint *)(lVar9 + -4 + uVar13 * 4);
            }
            else {
              if (uVar13 != 0) {
                if (*(char *)(lVar12 + -1 + uVar13) == '\0') {
                  if (*(char *)(lVar11 + uVar13) == '\0') goto LAB_002174d5;
                  uVar6 = *(uint *)(lVar10 + uVar13 * 4);
                }
                else {
                  uVar6 = *(uint *)(lVar9 + -4 + uVar13 * 4);
                }
                j = *(uint *)(lVar9 + 4 + uVar13 * 4);
                goto LAB_002174b6;
              }
LAB_002174d5:
              uVar6 = *(uint *)(lVar9 + 4 + uVar13 * 4);
            }
          }
          else {
LAB_002173e5:
            uVar6 = *(uint *)(lVar9 + uVar13 * 4);
          }
          *(uint *)(lVar1 + uVar13 * 4) = uVar6;
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      lVar8 = lVar8 + 1;
      local_48 = local_48 + 1;
    } while (lVar8 != lVar7);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        // memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0
#define CONDITION_Q_BG r > 0 && img_row_prev[c] == 0
#define CONDITION_S_BG c > 0 && img_row[c - 1] == 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_bg_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
#undef CONDITION_Q_BG
#undef CONDITION_S_BG
    }